

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condexe.cc
# Opt level: O0

bool __thiscall ConditionalExecution::trial(ConditionalExecution *this,BlockBasic *ib)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int4 iVar4;
  int4 iVar5;
  int4 iVar6;
  PcodeOp *pPVar7;
  BlockBasic *pBVar8;
  BlockBasic *pBVar9;
  BlockBasic *pBVar10;
  BlockBasic *pBVar11;
  uint uVar12;
  size_t in_RCX;
  uchar *sig;
  uchar *extraout_RDX;
  uchar *sig_00;
  uchar *extraout_RDX_00;
  uchar *in_R8;
  size_t in_R9;
  bool directsplit_copy;
  BlockBasic *postb_block_copy;
  BlockBasic *posta_block_copy;
  int4 posta_outslot_copy;
  int4 camethruposta_slot_copy;
  bool iblock2posta_true_copy;
  bool init2a_true_copy;
  int4 prea_inslot_copy;
  BlockBasic *iblock_copy;
  BlockBasic *initblock_copy;
  PcodeOp *cbranch_copy;
  BlockBasic *ib_local;
  ConditionalExecution *this_local;
  
  this->iblock = ib;
  buildHeritageArray(this);
  uVar12 = verify(this,(EVP_PKEY_CTX *)ib,sig,in_RCX,in_R8,in_R9);
  sig_00 = extraout_RDX;
  if ((uVar12 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    do {
      if ((this->directsplit & 1U) == 0) {
        return true;
      }
      pPVar7 = this->cbranch;
      pBVar8 = this->initblock;
      pBVar9 = this->iblock;
      iVar4 = this->prea_inslot;
      bVar1 = this->init2a_true;
      bVar2 = this->iblock2posta_true;
      iVar5 = this->camethruposta_slot;
      iVar6 = this->posta_outslot;
      pBVar10 = this->posta_block;
      pBVar11 = this->postb_block;
      bVar3 = this->directsplit;
      this->iblock = this->posta_block;
      uVar12 = verify(this,(EVP_PKEY_CTX *)ib,sig_00,in_RCX,in_R8,in_R9);
      sig_00 = extraout_RDX_00;
    } while ((uVar12 & 1) != 0);
    this->cbranch = pPVar7;
    this->initblock = pBVar8;
    this->iblock = pBVar9;
    this->prea_inslot = iVar4;
    this->init2a_true = (bool)(bVar1 & 1);
    this->iblock2posta_true = (bool)(bVar2 & 1);
    this->camethruposta_slot = iVar5;
    this->posta_outslot = iVar6;
    this->posta_block = pBVar10;
    this->postb_block = pBVar11;
    this->directsplit = (bool)(bVar3 & 1);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ConditionalExecution::trial(BlockBasic *ib)

{
  iblock = ib;
  buildHeritageArray();
  if (!verify()) return false;

  PcodeOp *cbranch_copy;
  BlockBasic *initblock_copy;
  BlockBasic *iblock_copy;
  int4 prea_inslot_copy;
  bool init2a_true_copy;
  bool iblock2posta_true_copy;
  int4 camethruposta_slot_copy;
  int4 posta_outslot_copy;
  BlockBasic *posta_block_copy;
  BlockBasic *postb_block_copy;
  bool directsplit_copy;

  for(;;) {
    if (!directsplit) return true;
    // Save off the data for current iblock
    cbranch_copy = cbranch;
    initblock_copy = initblock;
    iblock_copy = iblock;
    prea_inslot_copy = prea_inslot;
    init2a_true_copy = init2a_true;
    iblock2posta_true_copy = iblock2posta_true;
    camethruposta_slot_copy = camethruposta_slot;
    posta_outslot_copy = posta_outslot;
    posta_block_copy = posta_block;
    postb_block_copy = postb_block;
    directsplit_copy = directsplit;

    iblock = posta_block;
    if (!verify()) {
      cbranch = cbranch_copy;
      initblock = initblock_copy;
      iblock = iblock_copy;
      prea_inslot = prea_inslot_copy;
      init2a_true = init2a_true_copy;
      iblock2posta_true = iblock2posta_true_copy;
      camethruposta_slot = camethruposta_slot_copy;
      posta_outslot = posta_outslot_copy;
      posta_block = posta_block_copy;
      postb_block = postb_block_copy;
      directsplit = directsplit_copy;
      return true;
    }
  }
}